

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open_address_file_hash_dictionary_handler.c
# Opt level: O2

ion_err_t oafdict_create_dictionary
                    (ion_dictionary_id_t id,ion_key_type_t key_type,ion_key_size_t key_size,
                    ion_value_size_t value_size,ion_dictionary_size_t dictionary_size,
                    ion_dictionary_compare_t compare,ion_dictionary_handler_t *handler,
                    ion_dictionary_t *dictionary)

{
  ion_err_t iVar1;
  ion_file_hashmap_t *hashmap;
  
  hashmap = (ion_file_hashmap_t *)malloc(0x38);
  dictionary->instance = (ion_dictionary_parent_t *)hashmap;
  (hashmap->super).compare = compare;
  (hashmap->super).type = dictionary_type_open_address_file_hash_t;
  oafh_initialize(hashmap,oafh_compute_simple_hash,key_type,key_size,value_size,dictionary_size,id);
  if (handler == (ion_dictionary_handler_t *)0x0) {
    iVar1 = '\x12';
  }
  else {
    dictionary->handler = handler;
    iVar1 = '\0';
  }
  return iVar1;
}

Assistant:

ion_err_t
oafdict_create_dictionary(
	ion_dictionary_id_t			id,
	ion_key_type_t				key_type,
	ion_key_size_t				key_size,
	ion_value_size_t			value_size,
	ion_dictionary_size_t		dictionary_size,
	ion_dictionary_compare_t	compare,
	ion_dictionary_handler_t	*handler,
	ion_dictionary_t			*dictionary
) {
	UNUSED(id);
	/* this is the instance of the hashmap */
	dictionary->instance			= malloc(sizeof(ion_file_hashmap_t));

	dictionary->instance->compare	= compare;
	dictionary->instance->type		= dictionary_type_open_address_file_hash_t;

	/* this registers the dictionary the dictionary */
	oafh_initialize((ion_file_hashmap_t *) dictionary->instance, oafh_compute_simple_hash, key_type, key_size, value_size, dictionary_size, id);/* just pick an arbitary size for testing atm */

	/*TODO The correct comparison operator needs to be bound at run time
	 * based on the type of key defined
	*/

	if (NULL == handler) {
		return err_uninitialized;
	}

	/* register the correct handler */
	dictionary->handler = handler;

	return 0;
}